

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::TextureCubeView::sample
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  TextureFormat TVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  int depth;
  int iVar10;
  long lVar11;
  IVec3 *in_RDX;
  long lVar12;
  long lVar13;
  Vector<float,_4> *res;
  int iVar14;
  int iVar15;
  CubeFace baseFace;
  Sampler *sampler_00;
  bool *pbVar16;
  float t_00;
  float fVar17;
  float fVar18;
  float fVar20;
  float fVar21;
  Vec4 VVar22;
  CubeFaceFloatCoords CVar23;
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess faceAccesses1 [6];
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  TextureFormat local_220;
  undefined1 local_218 [8];
  TextureFormat TStack_210;
  int local_208 [2];
  void *pvStack_200;
  TextureFormat TStack_1f8;
  int iStack_1f0;
  int local_1ec;
  ChannelOrder CStack_1e8;
  int aiStack_1e4 [45];
  undefined8 auStack_130 [2];
  undefined4 local_120 [2];
  undefined8 auStack_118 [29];
  undefined8 uVar19;
  
  local_218._4_4_ = t;
  local_218._0_4_ = s;
  TStack_210.order = (ChannelOrder)r;
  CVar23 = getCubeFaceCoords((Vec3 *)local_218);
  t_00 = CVar23.t;
  uVar9 = CVar23._0_8_;
  fVar18 = CVar23.s;
  if ((char)in_RDX[4].m_data[1] != '\x01') {
    local_218 = (undefined1  [8])0x0;
    TStack_210 = (TextureFormat)((ulong)TStack_210.type << 0x20);
    VVar22 = sampleLevelArray2DOffset
                       ((ConstPixelBufferAccess *)this,
                        (int)*(undefined8 *)(&sampler->wrapR + (uVar9 & 0xffffffff) * 2),
                        (Sampler *)(ulong)sampler->wrapS,fVar18,t_00,lod,in_RDX);
    fVar20 = VVar22.m_data[2];
    fVar21 = VVar22.m_data[3];
    uVar19 = VVar22.m_data._0_8_;
    goto LAB_0015be56;
  }
  fVar20 = (float)in_RDX[1].m_data[2];
  fVar21 = 0.0;
  uVar3 = in_RDX[1].m_data[lod <= fVar20];
  if (5 < uVar3) {
    uVar19 = 0;
    this->m_numLevels = 0;
    *(undefined4 *)&this->field_0x4 = 0;
    this->m_levels[0] = (ConstPixelBufferAccess *)0x0;
    goto LAB_0015be56;
  }
  pbVar16 = (bool *)&sampler->wrapR;
  depth = (int)in_RDX;
  switch(uVar3) {
  case 0:
    sampler_00 = *(Sampler **)((long)pbVar16 + (uVar9 & 0xffffffff) * 2 * 4);
    TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
    local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
    pvStack_200 = *(void **)in_RDX[2].m_data;
    TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
    aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
    local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 1:
    lVar12 = 8;
    do {
      *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
      *(undefined8 *)(local_218 + lVar12) = 0;
      *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
      *(undefined8 *)((long)local_208 + lVar12) = 0;
      *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf8);
    lVar12 = 0;
    do {
      puVar1 = *(undefined8 **)pbVar16;
      (&TStack_1f8)[lVar12] = *(TextureFormat *)(puVar1 + 4);
      uVar19 = *puVar1;
      TVar5 = *(TextureFormat *)(puVar1 + 1);
      pvVar6 = (void *)puVar1[3];
      *(undefined8 *)(local_208 + lVar12 * 2) = puVar1[2];
      (&pvStack_200)[lVar12] = pvVar6;
      *(undefined8 *)(local_218 + lVar12 * 8) = uVar19;
      (&TStack_210)[lVar12] = TVar5;
      lVar12 = lVar12 + 5;
      pbVar16 = pbVar16 + 8;
    } while (lVar12 != 0x1e);
    baseFace = (CubeFace)local_218;
LAB_0015be51:
    VVar22 = sampleCubeSeamlessLinear
                       ((ConstPixelBufferAccess (*) [6])this,baseFace,
                        (Sampler *)(uVar9 & 0xffffffff),fVar18,t_00,depth);
    fVar20 = VVar22.m_data[2];
    fVar21 = VVar22.m_data[3];
    uVar19 = VVar22.m_data._0_8_;
    goto LAB_0015be56;
  default:
    iVar14 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar20 = ceilf(lod + 0.5);
    iVar15 = (int)fVar20 + -1;
    if (iVar15 < iVar14) {
      iVar14 = iVar15;
    }
    iVar10 = 0;
    if (-1 < iVar15) {
      iVar10 = iVar14;
    }
    if (uVar3 == 4) {
      lVar12 = 8;
      do {
        *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar12) = 0;
        *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
        *(undefined8 *)((long)local_208 + lVar12) = 0;
        *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar11 = (long)iVar10;
      lVar12 = 0;
      do {
        lVar13 = *(long *)pbVar16;
        (&TStack_1f8)[lVar12] = *(TextureFormat *)(lVar13 + 0x20 + lVar11 * 0x28);
        puVar1 = (undefined8 *)(lVar13 + lVar11 * 0x28);
        uVar19 = *puVar1;
        TVar5 = *(TextureFormat *)(puVar1 + 1);
        puVar1 = (undefined8 *)(lVar13 + 0x10 + lVar11 * 0x28);
        pvVar6 = (void *)puVar1[1];
        *(undefined8 *)(local_208 + lVar12 * 2) = *puVar1;
        (&pvStack_200)[lVar12] = pvVar6;
        *(undefined8 *)(local_218 + lVar12 * 8) = uVar19;
        (&TStack_210)[lVar12] = TVar5;
        lVar12 = lVar12 + 5;
        pbVar16 = pbVar16 + 8;
      } while (lVar12 != 0x1e);
      baseFace = (CubeFace)local_218;
      goto LAB_0015be51;
    }
    sampler_00 = (Sampler *)
                 ((long)iVar10 * 0x28 + *(long *)((long)pbVar16 + (uVar9 & 0xffffffff) * 2 * 4));
    TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
    local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
    pvStack_200 = *(void **)in_RDX[2].m_data;
    TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
    aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
    local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 3:
  case 5:
    iVar15 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar17 = floorf(lod);
    iVar10 = (int)fVar17;
    iVar14 = iVar15;
    if (iVar10 < iVar15) {
      iVar14 = iVar10;
    }
    if (iVar10 < 0) {
      iVar14 = 0;
    }
    if (iVar14 + 1 <= iVar15) {
      iVar15 = iVar14 + 1;
    }
    fVar17 = lod - fVar17;
    local_238._0_4_ = R;
    local_238._4_4_ = SNORM_INT8;
    local_238._8_4_ = 0;
    local_238._12_4_ = 0;
    local_248._0_4_ = R;
    local_248._4_4_ = SNORM_INT8;
    local_248._8_4_ = 0;
    local_248._12_4_ = 0;
    if (uVar3 == 5) {
      lVar12 = 8;
      do {
        *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar12) = 0;
        *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
        *(undefined8 *)((long)local_208 + lVar12) = 0;
        *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar12 = 8;
      do {
        *(undefined8 *)((long)auStack_130 + lVar12) = 0x2600000015;
        *(undefined8 *)((long)local_120 + lVar12 + -8) = 0;
        *(undefined8 *)((long)local_120 + lVar12) = 0;
        *(undefined8 *)((long)auStack_118 + lVar12) = 0;
        *(undefined8 *)((long)auStack_118 + lVar12 + 8) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar11 = (long)iVar14;
      lVar13 = (long)iVar15;
      lVar12 = 0;
      do {
        lVar4 = *(long *)pbVar16;
        (&TStack_1f8)[lVar12] = *(TextureFormat *)(lVar4 + 0x20 + lVar11 * 0x28);
        puVar1 = (undefined8 *)(lVar4 + lVar11 * 0x28);
        uVar19 = *puVar1;
        TVar5 = *(TextureFormat *)(puVar1 + 1);
        puVar1 = (undefined8 *)(lVar4 + 0x10 + lVar11 * 0x28);
        pvVar6 = (void *)puVar1[1];
        *(undefined8 *)(local_208 + lVar12 * 2) = *puVar1;
        (&pvStack_200)[lVar12] = pvVar6;
        *(undefined8 *)(local_218 + lVar12 * 8) = uVar19;
        (&TStack_210)[lVar12] = TVar5;
        puVar1 = (undefined8 *)(lVar4 + lVar13 * 0x28);
        uVar19 = puVar1[1];
        puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar13 * 0x28);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        *(undefined8 *)(local_120 + lVar12 * 2 + -2) = *puVar1;
        *(undefined8 *)(local_120 + lVar12 * 2) = uVar19;
        auStack_118[lVar12] = uVar7;
        auStack_118[lVar12 + 1] = uVar8;
        auStack_118[lVar12 + 2] = *(undefined8 *)(lVar4 + 0x20 + lVar13 * 0x28);
        lVar12 = lVar12 + 5;
        pbVar16 = pbVar16 + 8;
      } while (lVar12 != 0x1e);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_238,(CubeFace)local_218,
                 (Sampler *)(uVar9 & 0xffffffff),fVar18,t_00,depth);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_248,(CubeFace)(auStack_130 + 1),
                 (Sampler *)(uVar9 & 0xffffffff),fVar18,t_00,depth);
    }
    else {
      local_220 = (TextureFormat)(uVar9 & 0xffffffff);
      TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
      local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
      pvStack_200 = *(void **)in_RDX[2].m_data;
      TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
      aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
      iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
      local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      local_218 = (undefined1  [8])0x0;
      auStack_130[1] = 0;
      local_120[0] = 0;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_238,
                 (Sampler *)
                 ((long)iVar14 * 0x28 + *(long *)((long)pbVar16 + (long)local_220 * 2 * 4)),
                 (FilterMode)local_218,fVar18,t_00,(IVec3 *)0x0);
      TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
      local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
      pvStack_200 = *(void **)in_RDX[2].m_data;
      TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
      aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
      iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
      local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      local_218 = (undefined1  [8])0x0;
      auStack_130[1] = 0;
      local_120[0] = 0;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_248,
                 (Sampler *)
                 ((long)iVar15 * 0x28 + *(long *)((long)pbVar16 + (long)local_220 * 2 * 4)),
                 (FilterMode)local_218,fVar18,t_00,(IVec3 *)0x0);
    }
    fVar18 = 1.0 - fVar17;
    uVar19 = CONCAT44(fVar18 * (float)local_238._4_4_,fVar18 * (float)local_238._0_4_);
    fVar20 = fVar17 * (float)local_248._0_4_ + fVar18 * (float)local_238._0_4_;
    fVar21 = fVar17 * (float)local_248._4_4_ + fVar18 * (float)local_238._4_4_;
    this->m_numLevels = (int)fVar20;
    *(float *)&this->field_0x4 = fVar21;
    *(float *)this->m_levels = fVar17 * (float)local_248._8_4_ + fVar18 * (float)local_238._8_4_;
    *(float *)((long)this->m_levels + 4) =
         fVar17 * (float)local_248._12_4_ + fVar18 * (float)local_238._12_4_;
    goto LAB_0015be56;
  }
  local_120[0] = 0;
  auStack_130[1] = 0;
  local_218 = (undefined1  [8])0x0;
  VVar22 = ConstPixelBufferAccess::sample2DOffset
                     ((ConstPixelBufferAccess *)this,sampler_00,(FilterMode)local_218,fVar18,t_00,
                      (IVec3 *)0x0);
  fVar20 = VVar22.m_data[2];
  fVar21 = VVar22.m_data[3];
  uVar19 = VVar22.m_data._0_8_;
LAB_0015be56:
  VVar22.m_data[3] = fVar21;
  VVar22.m_data[2] = fVar20;
  VVar22.m_data[0] = (float)(int)uVar19;
  VVar22.m_data[1] = (float)(int)((ulong)uVar19 >> 0x20);
  return (Vec4)VVar22.m_data;
}

Assistant:

tcu::Vec4 TextureCubeView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamless(m_levels, m_numLevels, coords.face, sampler, coords.s, coords.t, 0 /* depth */, lod);
	else
		return sampleLevelArray2D(m_levels[coords.face], m_numLevels, sampler, coords.s, coords.t, 0 /* depth */, lod);
}